

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
AdapterPromiseNode<capnp::AnyPointer::Pipeline,_kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>_>
::fulfill(AdapterPromiseNode<capnp::AnyPointer::Pipeline,_kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>_>
          *this,Pipeline *value)

{
  Pipeline *value_00;
  ExceptionOr<capnp::AnyPointer::Pipeline> local_1a8;
  Pipeline *local_18;
  Pipeline *value_local;
  AdapterPromiseNode<capnp::AnyPointer::Pipeline,_kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>_>
  *this_local;
  
  if ((this->waiting & 1U) != 0) {
    this->waiting = false;
    local_18 = value;
    value_local = (Pipeline *)this;
    value_00 = mv<capnp::AnyPointer::Pipeline>(value);
    ExceptionOr<capnp::AnyPointer::Pipeline>::ExceptionOr(&local_1a8,value_00);
    ExceptionOr<capnp::AnyPointer::Pipeline>::operator=(&this->result,&local_1a8);
    ExceptionOr<capnp::AnyPointer::Pipeline>::~ExceptionOr(&local_1a8);
    AdapterPromiseNodeBase::setReady(&this->super_AdapterPromiseNodeBase);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }